

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  MessageLite *elem;
  LogFinisher local_61;
  LogMessage local_60;
  Extension *extension;
  
  bVar1 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar1) {
    extension->type = type;
    CVar2 = anon_unknown_29::cpp_type(type);
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,500);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    extension->is_repeated = false;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      elem = (MessageLite *)operator_new(0x20);
      elem->_vptr_MessageLite = (_func_int **)(elem + 2);
      elem[1]._vptr_MessageLite = (_func_int **)0x0;
      *(undefined1 *)&elem[2]._vptr_MessageLite = 0;
    }
    else {
      elem = (MessageLite *)
             Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
      elem->_vptr_MessageLite = (_func_int **)(elem + 2);
      elem[1]._vptr_MessageLite = (_func_int **)0x0;
      *(undefined1 *)&elem[2]._vptr_MessageLite = 0;
      Arena::AddListNode(this_00,elem,arena_destruct_object<std::__cxx11::string>);
    }
    (extension->field_0).message_value = elem;
  }
  else {
    if (extension->is_repeated != false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1f8);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    CVar2 = anon_unknown_29::cpp_type(extension->type);
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1f8);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_61,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
  }
  extension->field_0xa = extension->field_0xa & 0xf0;
  return (string *)(extension->field_0).int64_value;
}

Assistant:

string* ExtensionSet::MutableString(int number, FieldType type,
                                    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}